

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O2

void Gia_ManSwiSimInfoRandom(Gia_ManSwi_t *p,uint *pInfo,int nProbNum)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (nProbNum == -1) {
    uVar1 = Gia_ManRandom(0);
    uVar2 = Gia_ManRandom(0);
    uVar3 = Gia_ManRandom(0);
    uVar4 = Gia_ManRandom(0);
    uVar5 = Gia_ManRandom(0);
    for (uVar6 = (ulong)(uint)p->nWords; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      pInfo[uVar6 - 1] = pInfo[uVar6 - 1] ^ (uVar5 & uVar4 & uVar3 | uVar2 & uVar1);
    }
  }
  else if (nProbNum < 1) {
    if (nProbNum != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSwitch.c"
                    ,0xac,"void Gia_ManSwiSimInfoRandom(Gia_ManSwi_t *, unsigned int *, int)");
    }
    for (uVar6 = (ulong)(uint)p->nWords; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      uVar1 = Gia_ManRandom(0);
      pInfo[uVar6 - 1] = uVar1;
    }
  }
  else {
    uVar1 = Gia_ManRandom(0);
    while (bVar7 = nProbNum != 0, nProbNum = nProbNum + -1, bVar7) {
      uVar2 = Gia_ManRandom(0);
      uVar1 = uVar1 & uVar2;
    }
    for (uVar6 = (ulong)(uint)p->nWords; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      pInfo[uVar6 - 1] = pInfo[uVar6 - 1] ^ uVar1;
    }
  }
  return;
}

Assistant:

static inline void Gia_ManSwiSimInfoRandom( Gia_ManSwi_t * p, unsigned * pInfo, int nProbNum )
{
    unsigned Mask = 0;
    int w, i;
    if ( nProbNum == -1 )
    { // 3/8 = 1/4 + 1/8
        Mask = (Gia_ManRandom( 0 ) & Gia_ManRandom( 0 )) | 
               (Gia_ManRandom( 0 ) & Gia_ManRandom( 0 ) & Gia_ManRandom( 0 ));
        for ( w = p->nWords-1; w >= 0; w-- )
            pInfo[w] ^= Mask;
    }
    else if ( nProbNum > 0 )
    {
        Mask = Gia_ManRandom( 0 );
        for ( i = 0; i < nProbNum; i++ )
            Mask &= Gia_ManRandom( 0 );
        for ( w = p->nWords-1; w >= 0; w-- )
            pInfo[w] ^= Mask;
    }
    else if ( nProbNum == 0 )
    {
        for ( w = p->nWords-1; w >= 0; w-- )
            pInfo[w] = Gia_ManRandom( 0 );
    }
    else
        assert( 0 );
}